

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O0

void do_asave(CHAR_DATA *ch,char *argument)

{
  string_view fmt;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AREA_DATA_conflict *pAVar5;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var6;
  char buf_2 [4608];
  char buf_1 [4608];
  bool found;
  int value;
  FILE *fp;
  AREA_DATA_conflict *pArea;
  char buf [4608];
  char arg1 [4608];
  CHAR_DATA *in_stack_ffffffffffffb778;
  char *in_stack_ffffffffffffb780;
  CHAR_DATA *in_stack_ffffffffffffb788;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffb790;
  CLogger *this;
  size_t in_stack_ffffffffffffb7a8;
  ulong uVar7;
  char *in_stack_ffffffffffffb7b0;
  char local_4848 [4624];
  char local_3638 [4];
  int in_stack_ffffffffffffc9cc;
  long in_stack_ffffffffffffc9d0;
  long in_stack_ffffffffffffc9d8;
  OBJ_DATA *in_stack_ffffffffffffc9e0;
  CHAR_DATA *in_stack_ffffffffffffc9e8;
  char *in_stack_ffffffffffffc9f0;
  AREA_DATA_conflict *in_stack_ffffffffffffcaa0;
  AREA_DATA_conflict *local_2420;
  char local_2418 [4608];
  char local_1218 [4608];
  char *in_stack_ffffffffffffffe8;
  
  bVar2 = false;
  bVar1 = check_security(in_stack_ffffffffffffb778);
  if (bVar1) {
    if (in_RDI == (CHAR_DATA *)0x0) {
      save_area_list();
      for (local_2420 = area_first; local_2420 != (AREA_DATA_conflict *)0x0;
          local_2420 = local_2420->next) {
        clean_olc_aflags((AREA_DATA_conflict *)0x78f5fb);
        save_area(in_stack_ffffffffffffcaa0);
      }
    }
    else {
      iVar3 = get_security(in_RDI);
      if (iVar3 < 10) {
        one_argument(in_stack_ffffffffffffb780,(char *)in_stack_ffffffffffffb778);
        if (local_1218[0] == '\0') {
          bVar2 = is_switched(in_RDI);
          if ((bVar2) ||
             ((((in_RDI->in_room->area->security < in_RDI->pcdata->security ||
                (pcVar4 = strstr(in_RDI->in_room->area->builders,in_RDI->name),
                pcVar4 == (char *)0x0)) &&
               (in_RDI->pcdata->security <= in_RDI->in_room->area->security)) &&
              (pcVar4 = strstr(in_RDI->in_room->area->builders,"All"), pcVar4 == (char *)0x0)))) {
            send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          }
          else {
            clean_olc_aflags((AREA_DATA_conflict *)0x78f753);
            save_area(in_stack_ffffffffffffcaa0);
            send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          }
        }
        else {
          bVar1 = str_cmp(local_1218,"changed");
          if (bVar1) {
            send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
            send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
            send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          }
          else {
            for (local_2420 = area_first; local_2420 != (AREA_DATA_conflict *)0x0;
                local_2420 = local_2420->next) {
              bVar1 = is_switched(in_RDI);
              if ((!bVar1) &&
                 (((in_RDI->pcdata->security <= local_2420->security &&
                   (pcVar4 = strstr(local_2420->builders,in_RDI->name), pcVar4 != (char *)0x0)) ||
                  ((local_2420->security < in_RDI->pcdata->security ||
                   (pcVar4 = strstr(local_2420->builders,"All"), pcVar4 != (char *)0x0)))))) {
                uVar7 = local_2420->area_flags[0];
                _Var6 = std::pow<int,int>(0,0x78f8a8);
                if ((uVar7 & (long)_Var6) == 0) {
                  uVar7 = local_2420->area_flags[0];
                  _Var6 = std::pow<int,int>(0,0x78f8db);
                  if ((uVar7 & (long)_Var6) == 0) goto LAB_0078f955;
                }
                bVar2 = true;
                clean_olc_aflags((AREA_DATA_conflict *)0x78f903);
                save_area(in_stack_ffffffffffffcaa0);
                sprintf(local_2418,"%24s - \'%s\'\n\r",local_2420->name,local_2420->file_name);
                send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
              }
LAB_0078f955:
            }
            if (!bVar2) {
              send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
            }
          }
        }
      }
      else {
        smash_tilde((char *)in_RSI);
        strcpy(local_1218,(char *)in_RSI);
        if (local_1218[0] == '\0') {
          send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
        }
        else {
          iVar3 = atoi(local_1218);
          pAVar5 = get_area_data(iVar3);
          if ((pAVar5 == (AREA_DATA_conflict *)0x0) &&
             (bVar2 = is_number((char *)in_stack_ffffffffffffb778), bVar2)) {
            send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
          }
          else {
            bVar2 = is_number((char *)in_stack_ffffffffffffb778);
            if (bVar2) {
              bVar2 = is_switched(in_RDI);
              if ((bVar2) ||
                 (((pAVar5->security < in_RDI->pcdata->security ||
                   (pcVar4 = strstr(pAVar5->builders,in_RDI->name), pcVar4 == (char *)0x0)) &&
                  ((in_RDI->pcdata->security <= pAVar5->security &&
                   (pcVar4 = strstr(pAVar5->builders,"All"), pcVar4 == (char *)0x0)))))) {
                send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
              }
              else {
                save_area_list();
                clean_olc_aflags((AREA_DATA_conflict *)0x78fbdd);
                save_area(in_stack_ffffffffffffcaa0);
              }
            }
            else {
              bVar2 = str_cmp("world",local_1218);
              if (bVar2) {
                bVar2 = str_cmp("changed",local_1218);
                if (bVar2) {
                  bVar2 = str_cmp(local_1218,"list");
                  if (bVar2) {
                    bVar2 = str_cmp(local_1218,"area");
                    if (bVar2) {
                      do_asave(in_RSI,in_stack_ffffffffffffffe8);
                    }
                    else if (in_RDI->desc->editor == 0) {
                      send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
                    }
                    else {
                      switch(in_RDI->desc->editor) {
                      case 1:
                        local_2420 = (AREA_DATA_conflict *)in_RDI->desc->pEdit;
                        break;
                      case 2:
                        local_2420 = in_RDI->in_room->area;
                        break;
                      case 3:
                        local_2420 = *(AREA_DATA_conflict **)((long)in_RDI->desc->pEdit + 0x28);
                        break;
                      case 4:
                        local_2420 = *(AREA_DATA_conflict **)((long)in_RDI->desc->pEdit + 0x28);
                        break;
                      default:
                        local_2420 = in_RDI->in_room->area;
                      }
                      bVar2 = is_switched(in_RDI);
                      if ((bVar2) ||
                         ((((local_2420->security < in_RDI->pcdata->security ||
                            (pcVar4 = strstr(local_2420->builders,in_RDI->name),
                            pcVar4 == (char *)0x0)) &&
                           (in_RDI->pcdata->security <= local_2420->security)) &&
                          (pcVar4 = strstr(local_2420->builders,"All"), pcVar4 == (char *)0x0)))) {
                        send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
                      }
                      else {
                        save_area_list();
                        clean_olc_aflags((AREA_DATA_conflict *)0x79024c);
                        save_area(in_stack_ffffffffffffcaa0);
                        send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
                      }
                    }
                  }
                  else {
                    save_area_list();
                  }
                }
                else {
                  save_area_list();
                  send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
                  sprintf(local_4848,"None.\n\r");
                  for (local_2420 = area_first; local_2420 != (AREA_DATA_conflict *)0x0;
                      local_2420 = local_2420->next) {
                    bVar2 = is_switched(in_RDI);
                    if ((!bVar2) &&
                       (((in_RDI->pcdata->security <= local_2420->security &&
                         (pcVar4 = strstr(local_2420->builders,in_RDI->name), pcVar4 != (char *)0x0)
                         ) || ((local_2420->security < in_RDI->pcdata->security ||
                               (pcVar4 = strstr(local_2420->builders,"All"), pcVar4 != (char *)0x0))
                              )))) {
                      in_stack_ffffffffffffb790 =
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           local_2420->area_flags[0];
                      _Var6 = std::pow<int,int>(0,0x78ff4a);
                      if (((ulong)in_stack_ffffffffffffb790 & (long)_Var6) == 0) {
                        in_stack_ffffffffffffb788 = (CHAR_DATA *)local_2420->area_flags[0];
                        _Var6 = std::pow<int,int>(0,0x78ff7d);
                        if (((ulong)in_stack_ffffffffffffb788 & (long)_Var6) == 0)
                        goto LAB_0078ffe9;
                      }
                      clean_olc_aflags((AREA_DATA_conflict *)0x78ff9d);
                      save_area(in_stack_ffffffffffffcaa0);
                      sprintf(local_4848,"%24s - \'%s\'\n\r",local_2420->name,local_2420->file_name)
                      ;
                      send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
                    }
LAB_0078ffe9:
                  }
                  bVar2 = str_cmp(local_4848,"None.\n\r");
                  if (!bVar2) {
                    send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
                  }
                }
              }
              else {
                save_area_list();
                for (local_2420 = area_first; local_2420 != (AREA_DATA_conflict *)0x0;
                    local_2420 = local_2420->next) {
                  bVar2 = is_switched(in_RDI);
                  if ((!bVar2) &&
                     ((((in_RDI->pcdata->security <= local_2420->security &&
                        (pcVar4 = strstr(local_2420->builders,in_RDI->name), pcVar4 != (char *)0x0))
                       || (local_2420->security < in_RDI->pcdata->security)) ||
                      (pcVar4 = strstr(local_2420->builders,"All"), pcVar4 != (char *)0x0)))) {
                    this = (CLogger *)local_2420->area_flags[0];
                    _Var6 = std::pow<int,int>(0,0x78fcff);
                    if ((((ulong)this & (long)_Var6) != 0) ||
                       (uVar7 = local_2420->area_flags[0], _Var6 = std::pow<int,int>(0,0x78fd32),
                       (uVar7 & (long)_Var6) != 0)) {
                      clean_olc_aflags((AREA_DATA_conflict *)0x78fd57);
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (in_stack_ffffffffffffb790,(char *)in_stack_ffffffffffffb788);
                      fmt._M_str = in_stack_ffffffffffffb7b0;
                      fmt._M_len = in_stack_ffffffffffffb7a8;
                      CLogger::Info<>(this,fmt);
                      sprintf(local_3638,"Saving..%s\n",local_2420->name);
                      wiznet(in_stack_ffffffffffffc9f0,in_stack_ffffffffffffc9e8,
                             in_stack_ffffffffffffc9e0,in_stack_ffffffffffffc9d8,
                             in_stack_ffffffffffffc9d0,in_stack_ffffffffffffc9cc);
                      save_area(in_stack_ffffffffffffcaa0);
                    }
                  }
                }
                send_to_char((char *)in_stack_ffffffffffffb790,in_stack_ffffffffffffb788);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_asave(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH], buf[MSL];
	AREA_DATA *pArea;
	FILE *fp;
	int value;
	bool found = false;

	fp = nullptr;

	if (!check_security(ch))
		return;

	if (!ch) /* Do an autosave */
	{
		save_area_list();

		for (pArea = area_first; pArea; pArea = pArea->next)
		{
			clean_olc_aflags(pArea);
			save_area(pArea);
		}

		return;
	}

	if (get_security(ch) < 10)
	{
		argument = one_argument(argument, arg1);

		if (arg1[0] == '\0')
		{
			if (IS_BUILDER(ch, ch->in_room->area))
			{
				clean_olc_aflags(ch->in_room->area);
				save_area(ch->in_room->area);
				send_to_char("Saved.\n\r", ch);
				return;
			}
			else
			{
				send_to_char("You are not in your area.\n\r", ch);
				return;
			}
		}
		else if (!str_cmp(arg1, "changed"))
		{
			for (pArea = area_first; pArea; pArea = pArea->next)
			{
				if (!IS_BUILDER(ch, pArea))
					continue;

				if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
				{
					found = true;
					clean_olc_aflags(pArea);
					save_area(pArea);
					sprintf(buf, "%24s - '%s'\n\r", pArea->name, pArea->file_name);
					send_to_char(buf, ch);
				}
			}

			if (!found)
				send_to_char("No areas were saved.\n\r", ch);
		}
		else
		{
			send_to_char("Syntax:\n\r", ch);
			send_to_char("  asave         - saves area you are currently in.\n\r", ch);
			send_to_char("  asave changed - saves all areas in your name that have been changed.\n\r", ch);
			return;
		}
	}
	else
	{
		smash_tilde(argument);
		strcpy(arg1, argument);

		if (arg1[0] == '\0')
		{
			send_to_char("Syntax:\n\r", ch);
			send_to_char("  asave <vnum>   - saves a particular area\n\r", ch);
			send_to_char("  asave list     - saves the area.lst file\n\r", ch);
			send_to_char("  asave area     - saves the area being edited\n\r", ch);
			send_to_char("  asave changed  - saves all changed zones\n\r", ch);
			send_to_char("  asave world    - saves the world! (db dump)\n\r", ch);
			send_to_char("\n\r", ch);
			return;
		}

		/* Snarf the value (which need not be numeric). */
		value = atoi(arg1);

		if (!(pArea = get_area_data(value)) && is_number(arg1))
		{
			send_to_char("That area does not exist.\n\r", ch);
			return;
		}

		/* Save area of given vnum. */
		/* ------------------------ */
		if (is_number(arg1))
		{
			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("You are not a builder for this area.\n\r", ch);
				return;
			}

			save_area_list();
			clean_olc_aflags(pArea);
			save_area(pArea);
			return;
		}

		/* Save the world, only authorized areas. */
		/* -------------------------------------- */
		if (!str_cmp("world", arg1))
		{
			save_area_list();

			for (pArea = area_first; pArea != nullptr; pArea = pArea->next)
			{
				char buf[MSL];

				if (!IS_BUILDER(ch, pArea))
					continue;

				if (!IS_SET(pArea->area_flags, AREA_CHANGED) && !IS_SET(pArea->area_flags, AREA_ADDED))
					continue;

				clean_olc_aflags(pArea);
				RS.Logger.Info(pArea->name);

				sprintf(buf, "Saving..%s\n", pArea->name);
				wiznet(buf, 0, nullptr, WIZ_DEBUG, 0, 0);

				save_area(pArea);
			}

			send_to_char("You saved the world.\n\r", ch);
			return;
		}

		/* Save changed areas, only authorized areas. */
		/* ------------------------------------------ */
		if (!str_cmp("changed", arg1))
		{
			char buf[MAX_INPUT_LENGTH];

			save_area_list();

			send_to_char("Saved zones:\n\r", ch);
			sprintf(buf, "None.\n\r");

			for (pArea = area_first; pArea; pArea = pArea->next)
			{
				/* Builder must be assigned this area. */
				if (!IS_BUILDER(ch, pArea))
					continue;

				/* Save changed areas. */
				if (IS_SET(pArea->area_flags, AREA_CHANGED) || IS_SET(pArea->area_flags, AREA_ADDED))
				{
					clean_olc_aflags(pArea);
					save_area(pArea);
					sprintf(buf, "%24s - '%s'\n\r", pArea->name, pArea->file_name);
					send_to_char(buf, ch);
				}
			}

			if (!str_cmp(buf, "None.\n\r"))
				send_to_char(buf, ch);

			return;
		}

		/* Save the area.lst file. */
		/* ----------------------- */
		if (!str_cmp(arg1, "list"))
		{
			save_area_list();
			return;
		}

		/* Save area being edited, if authorized. */
		/* -------------------------------------- */
		if (!str_cmp(arg1, "area"))
		{
			/* Is character currently editing. */
			if (ch->desc->editor == 0)
			{
				send_to_char("You are not editing an area therefore an area vnum is required.\n\r", ch);
				return;
			}

			/* Find the area to save. */
			switch (ch->desc->editor)
			{
				case ED_AREA:
					pArea = (AREA_DATA *)ch->desc->pEdit;
					break;
				case ED_ROOM:
					pArea = ch->in_room->area;
					break;
				case ED_OBJECT:
					pArea = ((OBJ_INDEX_DATA *)ch->desc->pEdit)->area;
					break;
				case ED_MOBILE:
					pArea = ((MOB_INDEX_DATA *)ch->desc->pEdit)->area;
					break;
				default:
					pArea = ch->in_room->area;
					break;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("You are not a builder for this area.\n\r", ch);
				return;
			}

			save_area_list();
			clean_olc_aflags(pArea);
			save_area(pArea);
			send_to_char("Area saved.\n\r", ch);
			return;
		}

		/* Show correct syntax. */
		/* -------------------- */
		do_asave(ch, "");
	}
}